

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

bool __thiscall Game::hasCard(Game *this,size_t playerID,Card card)

{
  bool bVar1;
  reference __x;
  vector<Card,_std::allocator<Card>_> local_50;
  undefined1 local_38 [8];
  value_type playerHand;
  size_t playerID_local;
  Game *this_local;
  Card card_local;
  
  playerHand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)playerID;
  __x = std::
        vector<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
        ::at(&this->m_playerCards,playerID);
  std::vector<Card,_std::allocator<Card>_>::vector
            ((vector<Card,_std::allocator<Card>_> *)local_38,__x);
  std::vector<Card,_std::allocator<Card>_>::vector
            (&local_50,(vector<Card,_std::allocator<Card>_> *)local_38);
  bVar1 = contains<Card>(&local_50,card);
  std::vector<Card,_std::allocator<Card>_>::~vector(&local_50);
  std::vector<Card,_std::allocator<Card>_>::~vector((vector<Card,_std::allocator<Card>_> *)local_38)
  ;
  return bVar1;
}

Assistant:

bool Game::hasCard(size_t playerID, Card card){
   auto playerHand = m_playerCards.at(playerID);
   return contains(playerHand, card);
}